

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::Coap::RequestHolder::RequestHolder
          (RequestHolder *this,RequestPtr *aRequest,ResponseHandler *aHandler)

{
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_50 [2];
  rep local_40;
  uint32_t local_38 [2];
  uint32_t delay;
  uint32_t upperBound;
  uint32_t lowBound;
  ResponseHandler *local_20;
  ResponseHandler *aHandler_local;
  RequestPtr *aRequest_local;
  RequestHolder *this_local;
  
  local_20 = aHandler;
  aHandler_local = (ResponseHandler *)aRequest;
  aRequest_local = &this->mRequest;
  std::shared_ptr<ot::commissioner::coap::Message>::shared_ptr(&this->mRequest,aRequest);
  std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
            (&this->mHandler,aHandler);
  this->mRetransmissionCount = 0;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&this->mNextTimerShot);
  this->mAcknowledged = false;
  delay = 2000;
  local_38[1] = 3000;
  local_38[0] = random::non_crypto::GetUint32InRange(2000,3000);
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_40,local_38);
  (this->mRetransmissionDelay).__r = local_40;
  local_50[0].__d.__r = (duration)std::chrono::_V2::system_clock::now();
  tVar1 = std::chrono::operator+(local_50,&this->mRetransmissionDelay);
  (this->mNextTimerShot).__d.__r = (rep)tVar1.__d.__r;
  return;
}

Assistant:

Coap::RequestHolder::RequestHolder(const RequestPtr &aRequest, ResponseHandler aHandler)
    : mRequest(aRequest)
    , mHandler(aHandler)
    , mRetransmissionCount(0)
    , mAcknowledged(false)
{
    uint32_t lowBound    = 1000 * kAckTimeout;
    uint32_t upperBound  = 1000 * kAckTimeout * kAckRandomFactorNumerator / kAckRandomFactorDenominator;
    uint32_t delay       = random::non_crypto::GetUint32InRange(lowBound, upperBound);
    mRetransmissionDelay = std::chrono::milliseconds(delay);
    mNextTimerShot       = Clock::now() + mRetransmissionDelay;
}